

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# futex.h
# Opt level: O0

int absl::lts_20250127::synchronization_internal::FutexImpl::WaitAbsoluteTimeout
              (atomic<int> *v,int32_t val,timespec *abs_timeout)

{
  FutexTimespec *pFVar1;
  long lVar2;
  int *piVar3;
  long err;
  FutexTimespec ts;
  timespec *abs_timeout_local;
  int32_t val_local;
  atomic<int> *v_local;
  
  ts.tv_nsec = (long)abs_timeout;
  pFVar1 = ToFutexTimespec(abs_timeout,(FutexTimespec *)&err);
  lVar2 = syscall(0xca,v,0x189,(ulong)(uint)val,pFVar1,0,0xffffffff);
  if (lVar2 == 0) {
    v_local._4_4_ = 0;
  }
  else {
    piVar3 = __errno_location();
    v_local._4_4_ = -*piVar3;
  }
  return v_local._4_4_;
}

Assistant:

static int WaitAbsoluteTimeout(std::atomic<int32_t>* v, int32_t val,
                                 const struct timespec* abs_timeout) {
    FutexTimespec ts;
    // https://locklessinc.com/articles/futex_cheat_sheet/
    // Unlike FUTEX_WAIT, FUTEX_WAIT_BITSET uses absolute time.
    auto err = syscall(
        SYS_futex, reinterpret_cast<int32_t*>(v),
        FUTEX_WAIT_BITSET | FUTEX_PRIVATE_FLAG | FUTEX_CLOCK_REALTIME, val,
        ToFutexTimespec(abs_timeout, &ts), nullptr, FUTEX_BITSET_MATCH_ANY);
    if (err != 0) {
      return -errno;
    }
    return 0;
  }